

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DExporter::AttrHelper_Col4DArrToString
          (X3DExporter *this,aiColor4D *pArray,size_t pArray_Size,string *pTargetString)

{
  undefined8 *puVar1;
  size_type sVar2;
  pointer pcVar3;
  string *psVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  long *plVar8;
  size_type sVar9;
  string *__range2;
  ulong uVar10;
  undefined8 uVar11;
  float *pfVar12;
  undefined8 *local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  string *local_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTargetString->_M_string_length = 0;
  *(pTargetString->_M_dataplus)._M_p = '\0';
  local_f8 = pTargetString;
  std::__cxx11::string::reserve((ulong)pTargetString);
  if (pArray_Size != 0) {
    pfVar12 = &pArray->a;
    do {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_50,vsnprintf,0x3a,"%f",SUB84((double)((aiColor4D *)(pfVar12 + -3))->r,0));
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_138 = &local_128;
      puVar7 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar7) {
        local_128 = *puVar7;
        lStack_120 = plVar5[3];
      }
      else {
        local_128 = *puVar7;
        local_138 = (ulong *)*plVar5;
      }
      local_130 = plVar5[1];
      *plVar5 = (long)puVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_70,vsnprintf,0x3a,"%f",SUB84((double)pfVar12[-2],0));
      uVar10 = 0xf;
      if (local_138 != &local_128) {
        uVar10 = local_128;
      }
      if (uVar10 < local_70._M_string_length + local_130) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          uVar11 = local_70.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_70._M_string_length + local_130) goto LAB_00343e46;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_138);
      }
      else {
LAB_00343e46:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_138,(ulong)local_70._M_dataplus._M_p);
      }
      local_198 = &local_188;
      puVar1 = puVar6 + 2;
      if ((undefined8 *)*puVar6 == puVar1) {
        local_188 = *puVar1;
        uStack_180 = puVar6[3];
      }
      else {
        local_188 = *puVar1;
        local_198 = (undefined8 *)*puVar6;
      }
      local_190 = puVar6[1];
      *puVar6 = puVar1;
      puVar6[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
      local_118 = &local_108;
      puVar7 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar7) {
        local_108 = *puVar7;
        lStack_100 = plVar5[3];
      }
      else {
        local_108 = *puVar7;
        local_118 = (ulong *)*plVar5;
      }
      local_110 = plVar5[1];
      *plVar5 = (long)puVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_90,vsnprintf,0x3a,"%f",SUB84((double)pfVar12[-1],0));
      uVar10 = 0xf;
      if (local_118 != &local_108) {
        uVar10 = local_108;
      }
      if (uVar10 < local_90._M_string_length + local_110) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          uVar11 = local_90.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_90._M_string_length + local_110) goto LAB_00343f92;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_118);
      }
      else {
LAB_00343f92:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_118,(ulong)local_90._M_dataplus._M_p);
      }
      local_178 = &local_168;
      puVar1 = puVar6 + 2;
      if ((undefined8 *)*puVar6 == puVar1) {
        local_168 = *puVar1;
        uStack_160 = puVar6[3];
      }
      else {
        local_168 = *puVar1;
        local_178 = (undefined8 *)*puVar6;
      }
      local_170 = puVar6[1];
      *puVar6 = puVar1;
      puVar6[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_178);
      puVar7 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar7) {
        local_e0 = *puVar7;
        lStack_d8 = plVar5[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *puVar7;
        local_f0 = (ulong *)*plVar5;
      }
      local_e8 = plVar5[1];
      *plVar5 = (long)puVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_b0,vsnprintf,0x3a,"%f",SUB84((double)*pfVar12,0));
      uVar10 = 0xf;
      if (local_f0 != &local_e0) {
        uVar10 = local_e0;
      }
      if (uVar10 < local_b0._M_string_length + local_e8) {
        uVar11 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          uVar11 = local_b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar11 < local_b0._M_string_length + local_e8) goto LAB_003440d4;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_f0);
      }
      else {
LAB_003440d4:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_b0._M_dataplus._M_p)
        ;
      }
      local_158 = &local_148;
      puVar1 = puVar6 + 2;
      if ((undefined8 *)*puVar6 == puVar1) {
        local_148 = *puVar1;
        uStack_140 = puVar6[3];
      }
      else {
        local_148 = *puVar1;
        local_158 = (undefined8 *)*puVar6;
      }
      local_150 = puVar6[1];
      *puVar6 = puVar1;
      puVar6[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_158);
      local_d0 = &local_c0;
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_c0 = *plVar8;
        lStack_b8 = plVar5[3];
      }
      else {
        local_c0 = *plVar8;
        local_d0 = (long *)*plVar5;
      }
      local_c8 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_f8,(ulong)local_d0);
      if (local_d0 != &local_c0) {
        operator_delete(local_d0);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0);
      }
      if (local_178 != &local_168) {
        operator_delete(local_178);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (local_118 != &local_108) {
        operator_delete(local_118);
      }
      if (local_198 != &local_188) {
        operator_delete(local_198);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pfVar12 = pfVar12 + 4;
      pArray_Size = pArray_Size - 1;
    } while (pArray_Size != 0);
  }
  psVar4 = local_f8;
  std::__cxx11::string::resize((ulong)local_f8,(char)local_f8->_M_string_length + -1);
  sVar2 = psVar4->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (psVar4->_M_dataplus)._M_p;
    sVar9 = 0;
    do {
      if (pcVar3[sVar9] == ',') {
        pcVar3[sVar9] = '.';
      }
      sVar9 = sVar9 + 1;
    } while (sVar2 != sVar9);
  }
  return;
}

Assistant:

void X3DExporter::AttrHelper_Col4DArrToString(const aiColor4D* pArray, const size_t pArray_Size, string& pTargetString)
{
	pTargetString.clear();
	pTargetString.reserve(pArray_Size * 8);// (Number + space) * 4.
	for(size_t idx = 0; idx < pArray_Size; idx++)
		pTargetString.append(to_string(pArray[idx].r) + " " + to_string(pArray[idx].g) + " " + to_string(pArray[idx].b) + " " +
								to_string(pArray[idx].a) + " ");

	// remove last space symbol.
	pTargetString.resize(pTargetString.length() - 1);
	AttrHelper_CommaToPoint(pTargetString);
}